

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.h
# Opt level: O1

void __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
UnsafeArenaAddAllocated<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>>
          (RepeatedPtrFieldBase *this,
          Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>_> *value)

{
  int iVar1;
  void *pvVar2;
  bool bVar3;
  uint uVar4;
  Rep *pRVar5;
  void **ppvVar6;
  Nonnull<const_char_*> pcVar7;
  
  if (value == (Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>_> *)
               0x0) {
    pcVar7 = absl::lts_20250127::log_internal::MakeCheckOpString<void_const*,void_const*>
                       ((void *)0x0,(void *)0x0,"value != nullptr");
  }
  else {
    pcVar7 = (Nonnull<const_char_*>)0x0;
  }
  if (pcVar7 != (Nonnull<const_char_*>)0x0) {
    UnsafeArenaAddAllocated<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>>
              ();
  }
  bVar3 = SizeAtCapacity(this);
  if (bVar3) {
    InternalExtend(this,1);
  }
  else {
    bVar3 = AllocatedSizeAtCapacity(this);
    iVar1 = this->current_size_;
    if (bVar3) {
      ppvVar6 = element_at(this,iVar1);
      if (this->arena_ == (Arena *)0x0) {
        InternalOutOfLineDeleteMessageLite((MessageLite *)*ppvVar6);
      }
      goto LAB_002af4e7;
    }
    if (((ulong)this->tagged_rep_or_elem_ & 1) == 0) {
      uVar4 = (uint)(this->tagged_rep_or_elem_ != (void *)0x0);
    }
    else {
      pRVar5 = rep(this);
      uVar4 = pRVar5->allocated_size;
    }
    if (iVar1 < (int)uVar4) {
      ppvVar6 = element_at(this,this->current_size_);
      pvVar2 = *ppvVar6;
      if (((ulong)this->tagged_rep_or_elem_ & 1) == 0) {
        uVar4 = (uint)(this->tagged_rep_or_elem_ != (void *)0x0);
      }
      else {
        pRVar5 = rep(this);
        uVar4 = pRVar5->allocated_size;
      }
      ppvVar6 = element_at(this,uVar4);
      *ppvVar6 = pvVar2;
    }
    else if (((ulong)this->tagged_rep_or_elem_ & 1) == 0) goto LAB_002af4e7;
  }
  pRVar5 = rep(this);
  pRVar5->allocated_size = pRVar5->allocated_size + 1;
LAB_002af4e7:
  iVar1 = this->current_size_;
  this->current_size_ = iVar1 + 1;
  ppvVar6 = element_at(this,iVar1);
  *ppvVar6 = value;
  return;
}

Assistant:

void UnsafeArenaAddAllocated(Value<TypeHandler>* value) {
    ABSL_DCHECK_NE(value, nullptr);
    // Make room for the new pointer.
    if (SizeAtCapacity()) {
      // The array is completely full with no cleared objects, so grow it.
      InternalExtend(1);
      ++rep()->allocated_size;
    } else if (AllocatedSizeAtCapacity()) {
      // There is no more space in the pointer array because it contains some
      // cleared objects awaiting reuse.  We don't want to grow the array in
      // this case because otherwise a loop calling AddAllocated() followed by
      // Clear() would leak memory.
      using H = CommonHandler<TypeHandler>;
      Delete<H>(element_at(current_size_), arena_);
    } else if (current_size_ < allocated_size()) {
      // We have some cleared objects.  We don't care about their order, so we
      // can just move the first one to the end to make space.
      element_at(allocated_size()) = element_at(current_size_);
      ++rep()->allocated_size;
    } else {
      // There are no cleared objects.
      if (!using_sso()) ++rep()->allocated_size;
    }

    element_at(ExchangeCurrentSize(current_size_ + 1)) = value;
  }